

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Counter.cxx
# Opt level: O0

int __thiscall Fl_Counter::calc_mouseobj(Fl_Counter *this)

{
  uchar uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int W_1;
  int W;
  Fl_Counter *this_local;
  
  uVar1 = Fl_Widget::type((Fl_Widget *)this);
  if (uVar1 == '\0') {
    iVar2 = Fl_Widget::w((Fl_Widget *)this);
    iVar2 = (iVar2 * 0xf) / 100;
    iVar3 = Fl_Widget::x((Fl_Widget *)this);
    iVar4 = Fl_Widget::y((Fl_Widget *)this);
    iVar5 = Fl_Widget::h((Fl_Widget *)this);
    iVar3 = Fl::event_inside(iVar3,iVar4,iVar2,iVar5);
    if (iVar3 != 0) {
      return 1;
    }
    iVar3 = Fl_Widget::x((Fl_Widget *)this);
    iVar4 = Fl_Widget::y((Fl_Widget *)this);
    iVar5 = Fl_Widget::h((Fl_Widget *)this);
    iVar3 = Fl::event_inside(iVar3 + iVar2,iVar4,iVar2,iVar5);
    if (iVar3 != 0) {
      return 2;
    }
    iVar3 = Fl_Widget::x((Fl_Widget *)this);
    iVar4 = Fl_Widget::w((Fl_Widget *)this);
    iVar5 = Fl_Widget::y((Fl_Widget *)this);
    iVar6 = Fl_Widget::h((Fl_Widget *)this);
    iVar3 = Fl::event_inside(iVar3 + iVar4 + iVar2 * -2,iVar5,iVar2,iVar6);
    if (iVar3 != 0) {
      return 3;
    }
    iVar3 = Fl_Widget::x((Fl_Widget *)this);
    iVar4 = Fl_Widget::w((Fl_Widget *)this);
    iVar5 = Fl_Widget::y((Fl_Widget *)this);
    iVar6 = Fl_Widget::h((Fl_Widget *)this);
    iVar2 = Fl::event_inside((iVar3 + iVar4) - iVar2,iVar5,iVar2,iVar6);
    if (iVar2 != 0) {
      return 4;
    }
  }
  else {
    iVar2 = Fl_Widget::w((Fl_Widget *)this);
    iVar2 = (iVar2 * 0x14) / 100;
    iVar3 = Fl_Widget::x((Fl_Widget *)this);
    iVar4 = Fl_Widget::y((Fl_Widget *)this);
    iVar5 = Fl_Widget::h((Fl_Widget *)this);
    iVar3 = Fl::event_inside(iVar3,iVar4,iVar2,iVar5);
    if (iVar3 != 0) {
      return 2;
    }
    iVar3 = Fl_Widget::x((Fl_Widget *)this);
    iVar4 = Fl_Widget::w((Fl_Widget *)this);
    iVar5 = Fl_Widget::y((Fl_Widget *)this);
    iVar6 = Fl_Widget::h((Fl_Widget *)this);
    iVar2 = Fl::event_inside((iVar3 + iVar4) - iVar2,iVar5,iVar2,iVar6);
    if (iVar2 != 0) {
      return 3;
    }
  }
  return -1;
}

Assistant:

int Fl_Counter::calc_mouseobj() {
  if (type() == FL_NORMAL_COUNTER) {
    int W = w()*15/100;
    if (Fl::event_inside(x(), y(), W, h())) return 1;
    if (Fl::event_inside(x()+W, y(), W, h())) return 2;
    if (Fl::event_inside(x()+w()-2*W, y(), W, h())) return 3;
    if (Fl::event_inside(x()+w()-W, y(), W, h())) return 4;
  } else {
    int W = w()*20/100;
    if (Fl::event_inside(x(), y(), W, h())) return 2;
    if (Fl::event_inside(x()+w()-W, y(), W, h())) return 3;
  }
  return -1;
}